

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O3

void mpiabi_file_set_view_
               (MPIABI_Fint *fh,MPIABI_Fint *disp,MPIABI_Fint *etype,MPIABI_Fint *filetype,
               char *datarep,MPIABI_Fint *info,MPIABI_Fint *ierror,size_t datarep_len)

{
  mpi_file_set_view_();
  return;
}

Assistant:

void mpiabi_file_set_view_(
  const MPIABI_Fint * fh,
  const MPIABI_Fint * disp,
  const MPIABI_Fint * etype,
  const MPIABI_Fint * filetype,
  const char * datarep,
  const MPIABI_Fint * info,
  MPIABI_Fint * ierror,
  size_t datarep_len
) {
  return mpi_file_set_view_(
    fh,
    disp,
    etype,
    filetype,
    datarep,
    info,
    ierror,
    datarep_len
  );
}